

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

int lua_getinfo(lua_State *L,char *what,lua_Debug *ar)

{
  StkId pSVar1;
  int iVar2;
  char *pcVar3;
  Closure *local_58;
  TValue *io2;
  TValue *io1;
  TValue *func;
  CallInfo *ci;
  Closure *cl;
  int status;
  lua_Debug *ar_local;
  char *what_local;
  lua_State *L_local;
  
  if (*what == '>') {
    func = (TValue *)0x0;
    io1 = (TValue *)((L->top).offset + -0x10);
    ar_local = (lua_Debug *)(what + 1);
    (L->top).p = (StkId)((L->top).offset + -0x10);
  }
  else {
    func = (TValue *)ar->i_ci;
    io1 = (TValue *)(((CallInfo *)func)->func).p;
    ar_local = (lua_Debug *)what;
  }
  if ((io1->tt_ == 'F') || (io1->tt_ == 'f')) {
    local_58 = (Closure *)(io1->value_).gc;
  }
  else {
    local_58 = (Closure *)0x0;
  }
  iVar2 = auxgetinfo(L,(char *)ar_local,ar,local_58,(CallInfo *)func);
  pcVar3 = strchr((char *)ar_local,0x66);
  if (pcVar3 != (char *)0x0) {
    pSVar1 = (L->top).p;
    (pSVar1->val).value_ = io1->value_;
    (pSVar1->val).tt_ = io1->tt_;
    (L->top).p = (StkId)((L->top).offset + 0x10);
  }
  pcVar3 = strchr((char *)ar_local,0x4c);
  if (pcVar3 != (char *)0x0) {
    collectvalidlines(L,local_58);
  }
  return iVar2;
}

Assistant:

LUA_API int lua_getinfo (lua_State *L, const char *what, lua_Debug *ar) {
  int status;
  Closure *cl;
  CallInfo *ci;
  TValue *func;
  lua_lock(L);
  if (*what == '>') {
    ci = NULL;
    func = s2v(L->top.p - 1);
    api_check(L, ttisfunction(func), "function expected");
    what++;  /* skip the '>' */
    L->top.p--;  /* pop function */
  }
  else {
    ci = ar->i_ci;
    func = s2v(ci->func.p);
    lua_assert(ttisfunction(func));
  }
  cl = ttisclosure(func) ? clvalue(func) : NULL;
  status = auxgetinfo(L, what, ar, cl, ci);
  if (strchr(what, 'f')) {
    setobj2s(L, L->top.p, func);
    api_incr_top(L);
  }
  if (strchr(what, 'L'))
    collectvalidlines(L, cl);
  lua_unlock(L);
  return status;
}